

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

int skip_to_end_of_word_and_terminate(char **ppw,int eol)

{
  byte bVar1;
  char *pcVar2;
  ushort **ppuVar3;
  byte *pbVar4;
  
  ppuVar3 = __ctype_b_loc();
  pbVar4 = (byte *)*ppw;
  while (bVar1 = *pbVar4, (short)(*ppuVar3)[bVar1] < 0) {
    pbVar4 = pbVar4 + 1;
    *ppw = (char *)pbVar4;
  }
  if (eol == 0) {
    if (bVar1 == 0x20) goto LAB_00125120;
  }
  else if ((bVar1 == 10) || (bVar1 == 0xd)) {
LAB_00125120:
    do {
      *pbVar4 = 0;
      pcVar2 = *ppw;
      pbVar4 = (byte *)(pcVar2 + 1);
      *ppw = (char *)pbVar4;
    } while (((*ppuVar3)[(byte)pcVar2[1]] >> 0xd & 1) != 0);
    return -(uint)(-1 < (short)(*ppuVar3)[(byte)pcVar2[1]] && eol == 0) | 1;
  }
  return -1;
}

Assistant:

static int
skip_to_end_of_word_and_terminate(char **ppw, int eol)
{
	/* Forward until a space is found - use isgraph here */
	/* See http://www.cplusplus.com/reference/cctype/ */
	while (isgraph((unsigned char)**ppw)) {
		(*ppw)++;
	}

	/* Check end of word */
	if (eol) {
		/* must be a end of line */
		if ((**ppw != '\r') && (**ppw != '\n')) {
			return -1;
		}
	} else {
		/* must be a end of a word, but not a line */
		if (**ppw != ' ') {
			return -1;
		}
	}

	/* Terminate and forward to the next word */
	do {
		**ppw = 0;
		(*ppw)++;
	} while (isspace((unsigned char)**ppw));

	/* Check after term */
	if (!eol) {
		/* if it's not the end of line, there must be a next word */
		if (!isgraph((unsigned char)**ppw)) {
			return -1;
		}
	}

	/* ok */
	return 1;
}